

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O3

char __thiscall BOCC_CTA::tryC(BOCC_CTA *this,int tid)

{
  unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  DataItem *pDVar2;
  Transaction *this_01;
  char cVar3;
  int iVar4;
  mapped_type *ppTVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  rep rVar8;
  BOCC_CTA *pBVar9;
  set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_> *this_02;
  _Rb_tree_header *p_Var10;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar11;
  pair<std::_Rb_tree_iterator<Transaction_*>,_std::_Rb_tree_iterator<Transaction_*>_> pVar12;
  int local_84;
  BOCC_CTA *local_80;
  pthread_rwlock_t *local_78;
  _Rb_tree_node_base *local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_68;
  
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = (pthread_rwlock_t *)&this->scheduler_lock;
  local_84 = tid;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_78->__data);
  this_00 = &this->transactions;
  ppTVar5 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_84);
  p_Var7 = ((*ppTVar5)->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &((*ppTVar5)->readSet)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = this;
  if (p_Var7 != local_70) {
    do {
      pBVar9 = local_80;
      _Var1 = p_Var7[1]._M_color;
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)
                                 &(local_80->dataItems).
                                  super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(int)_Var1]->lock);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      pDVar2 = (pBVar9->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)_Var1];
      for (p_Var6 = *(_Base_ptr *)((long)&(pDVar2->read_list)._M_t._M_impl + 0x18);
          p_Var6 != (_Rb_tree_node_base *)((long)&(pDVar2->read_list)._M_t._M_impl + 8U);
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        this_01 = *(Transaction **)(p_Var6 + 1);
        cVar3 = Transaction::getStatus(this_01);
        if ((cVar3 == 'c') &&
           (ppTVar5 = std::__detail::
                      _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_00,&local_84),
           ((*ppTVar5)->start_time).__d.__r < (this_01->end_time).__d.__r)) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_68,&this_01->id);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_70);
  }
  pBVar9 = local_80;
  pVar11 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range(&local_68,&local_84);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&local_68,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
  if (local_68._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ppTVar5 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_84);
    Transaction::setStatus(*ppTVar5,'c');
    rVar8 = std::chrono::_V2::system_clock::now();
    ppTVar5 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_84);
    ((*ppTVar5)->end_time).__d.__r = rVar8;
    ppTVar5 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_84);
    p_Var7 = ((*ppTVar5)->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &((*ppTVar5)->writeSet)._M_t._M_impl.super__Rb_tree_header;
    cVar3 = 'c';
    if ((_Rb_tree_header *)p_Var7 != p_Var10) {
      do {
        _Var1 = p_Var7[1]._M_color;
        ppTVar5 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&local_84);
        pDVar2 = (pBVar9->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)_Var1];
        pDVar2->value =
             ((*ppTVar5)->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)_Var1];
        pthread_mutex_unlock((pthread_mutex_t *)&pDVar2->lock);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var10);
      cVar3 = 'c';
    }
  }
  else {
    ppTVar5 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_84);
    Transaction::setStatus(*ppTVar5,'a');
    rVar8 = std::chrono::_V2::system_clock::now();
    ppTVar5 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_84);
    ((*ppTVar5)->end_time).__d.__r = rVar8;
    ppTVar5 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_84);
    p_Var7 = ((*ppTVar5)->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &((*ppTVar5)->readSet)._M_t._M_impl.super__Rb_tree_header;
    cVar3 = 'a';
    if ((_Rb_tree_header *)p_Var7 != p_Var10) {
      do {
        _Var1 = p_Var7[1]._M_color;
        pDVar2 = (pBVar9->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)_Var1];
        ppTVar5 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&local_84);
        this_02 = &pDVar2->read_list;
        pVar12 = std::
                 _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
                 ::equal_range(&this_02->_M_t,ppTVar5);
        std::
        _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
        ::_M_erase_aux(&this_02->_M_t,(_Base_ptr)pVar12.first._M_node,
                       (_Base_ptr)pVar12.second._M_node);
        pBVar9 = local_80;
        pthread_mutex_unlock
                  ((pthread_mutex_t *)
                   &(local_80->dataItems).
                    super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)_Var1]->lock);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var10);
      cVar3 = 'a';
    }
  }
  pthread_rwlock_unlock(local_78);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_68);
  return cVar3;
}

Assistant:

char BOCC_CTA::tryC(const int tid) {
    std::set<int> conf_trans{};

    scheduler_lock.lock_shared();

    // lock all the data items, get conflicting transactions.
    for(auto e: transactions[tid]->readSet){
        // lock each data item.
        dataItems[e]->lock.lock();


        // todo: Might (or might not) need a lock on these transactions' status, if each transaction doesnt
        //  read AND write each data item it accesses (since multiple transactions can be in try commit at
        //  the same time - fine grained locking!
        //  Solution: Lock all items in the current transaction's writeSet along with those in readSet!
        // todo: Possibility of these transactions (in the readList) being deleted?
        // Seems to be 0, becauase we have acquired a shared_lock on the scheduler.
        // add all the conflicting and still running transactions here, they will be aborted.
        for(auto g: dataItems[e]->read_list){
            if(g->getStatus()=='c' && (transactions[tid]->start_time < g->end_time)) conf_trans.insert(g->id);
        }
    }
    conf_trans.erase(tid);
    // abort this transaction if conflicting transactions are present!
    if(!conf_trans.empty()){
        transactions[tid]->setStatus('a');
        transactions[tid]->end_time = std::chrono::high_resolution_clock::now();
        for(auto e: transactions[tid]->readSet){
            dataItems[e]->read_list.erase(transactions[tid]);
            dataItems[e]->lock.unlock();
        }
        scheduler_lock.unlock_shared();
        return 'a';
    }
    else{
        transactions[tid]->setStatus('c');
        transactions[tid]->end_time = std::chrono::high_resolution_clock::now();
        for(auto e: transactions[tid]->writeSet){
            dataItems[e]->value = transactions[tid]->local_write_store[e];
            dataItems[e]->lock.unlock();
        }
        scheduler_lock.unlock_shared();
        return 'c';

    }
}